

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBucket.cpp
# Opt level: O1

void __thiscall
Memory::
SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
::Sweep(SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
        *this,RecyclerSweep *recyclerSweep)

{
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  anon_class_16_2_19447d9f sweepFn;
  
  bVar3 = RecyclerSweep::IsBackground(recyclerSweep);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBucket.cpp"
                       ,100,"(!recyclerSweep.IsBackground())","!recyclerSweep.IsBackground()");
    if (!bVar3) goto LAB_0073e26b;
    *puVar4 = 0;
  }
  if (this->tempPendingDisposeList !=
      (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBucket.cpp"
                       ,0x67,"(this->tempPendingDisposeList == nullptr)",
                       "this->tempPendingDisposeList == nullptr");
    if (!bVar3) {
LAB_0073e26b:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pSVar1 = this->pendingDisposeList;
  this->tempPendingDisposeList = pSVar1;
  this->pendingDisposeList = (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
  sweepFn.currentDisposeList = pSVar1;
  sweepFn.this = this;
  HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>::
  SweepBucket<Memory::SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>::Sweep(Memory::RecyclerSweep&)::_lambda(Memory::RecyclerSweep&)_1_>
            ((HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>> *)this
             ,recyclerSweep,sweepFn);
  return;
}

Assistant:

void
SmallFinalizableHeapBucketBaseT<TBlockType>::Sweep(RecyclerSweep& recyclerSweep)
{
    Assert(!recyclerSweep.IsBackground());

#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED)
    Assert(this->tempPendingDisposeList == nullptr);
    this->tempPendingDisposeList = pendingDisposeList;
#endif

    TBlockType * currentDisposeList = pendingDisposeList;
    this->pendingDisposeList = nullptr;

    BaseT::SweepBucket(recyclerSweep, [=](RecyclerSweep& recyclerSweep)
    {
#if DBG
        if (TBlockType::HeapBlockAttributes::IsSmallBlock)
        {
            recyclerSweep.SetupVerifyListConsistencyDataForSmallBlock(nullptr, false, true);
        }
        else if (TBlockType::HeapBlockAttributes::IsMediumBlock)
        {
            recyclerSweep.SetupVerifyListConsistencyDataForMediumBlock(nullptr, false, true);
        }
        else
        {
            Assert(false);
        }
#endif

        HeapBucketT<TBlockType>::SweepHeapBlockList(recyclerSweep, currentDisposeList, false);

#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED)
        Assert(this->tempPendingDisposeList == currentDisposeList);
        this->tempPendingDisposeList = nullptr;
#endif
        RECYCLER_SLOW_CHECK(this->VerifyHeapBlockCount(recyclerSweep.IsBackground()));
    });

}